

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O2

CuTest * CuTestNew(char *name,TestFunction function)

{
  CuTest *t;
  
  t = (CuTest *)malloc(0x28);
  CuTestInit(t,name,function);
  return t;
}

Assistant:

CuTest* CuTestNew(const char* name, TestFunction function)
{
	CuTest* tc = CU_ALLOC(CuTest);
	CuTestInit(tc, name, function);
	return tc;
}